

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

size_t __thiscall CASC_ARRAY::IndexOf(CASC_ARRAY *this,void *pItem)

{
  bool bVar1;
  LPBYTE pbItem;
  void *pItem_local;
  CASC_ARRAY *this_local;
  
  bVar1 = false;
  if (this->m_pItemArray <= pItem) {
    bVar1 = pItem <= this->m_pItemArray + this->m_ItemCount * this->m_ItemSize;
  }
  if (!bVar1) {
    __assert_fail("(m_pItemArray <= pbItem) && (pbItem <= m_pItemArray + (m_ItemCount * m_ItemSize))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                  ,0x69,"size_t CASC_ARRAY::IndexOf(const void *)");
  }
  if ((ulong)((long)pItem - (long)this->m_pItemArray) % this->m_ItemSize == 0) {
    return (ulong)((long)pItem - (long)this->m_pItemArray) / this->m_ItemSize;
  }
  __assert_fail("((pbItem - m_pItemArray) % m_ItemSize) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                ,0x6a,"size_t CASC_ARRAY::IndexOf(const void *)");
}

Assistant:

size_t IndexOf(const void * pItem)
    {
        LPBYTE pbItem = (LPBYTE)pItem;

        assert((m_pItemArray <= pbItem) && (pbItem <= m_pItemArray + (m_ItemCount * m_ItemSize)));
        assert(((pbItem - m_pItemArray) % m_ItemSize) == 0);

        return ((pbItem - m_pItemArray) / m_ItemSize);
    }